

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp_arg_deduc.cpp
# Opt level: O0

void __thiscall sample<const_char_*>::sample(sample<const_char_*> *this,char *x,char *y,char *z)

{
  ostream *poVar1;
  char *z_local;
  char *y_local;
  char *x_local;
  sample<const_char_*> *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\tx:{");
  poVar1 = std::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1,"}\t");
  poVar1 = std::operator<<(poVar1,"y:{");
  poVar1 = std::operator<<(poVar1,y);
  poVar1 = std::operator<<(poVar1,"}\t");
  poVar1 = std::operator<<(poVar1,"z:{");
  poVar1 = std::operator<<(poVar1,z);
  poVar1 = std::operator<<(poVar1,"}\t");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

sample (Tn x, Tn y, Tn z)	 {
			std::cout << "\tx:{" <<x << "}\t"
				<< "y:{" << y << "}\t" << "z:{"
				<< z << "}\t" << std::endl;
		}